

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* reduce_rows_cols(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *__return_storage_ptr__,
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *mtrx,tuple<int,_int> *tpl)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  pointer pvVar7;
  
  lVar3 = (long)(tpl->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>.
                _M_head_impl;
  pvVar2 = (mtrx->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = *(long *)&pvVar2[lVar3 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl;
  lVar4 = (long)*(pointer *)
                 ((long)&pvVar2[lVar3 + -1].super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data + 8) - lVar5;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    lVar6 = 0;
    do {
      *(undefined8 *)(lVar5 + lVar6 * 8) = 0x7ff8000000000000;
      lVar6 = lVar6 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
  }
  lVar5 = (long)(mtrx->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 3) * -0x5555555555555555;
    iVar1 = (tpl->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pvVar7 = pvVar2;
    do {
      *(undefined8 *)
       (*(long *)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + -8 + (long)iVar1 * 8) = 0x7ff8000000000000;
      pvVar7 = pvVar7 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  *(undefined8 *)
   (*(long *)&pvVar2[(long)(tpl->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
                           super__Head_base<1UL,_int,_false>._M_head_impl + -1].
              super__Vector_base<double,_std::allocator<double>_>._M_impl + -8 + lVar3 * 8) =
       0x7ff8000000000000;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,mtrx);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> reduce_rows_cols(std::vector<std::vector<double>> &mtrx, std::tuple<int,int> &tpl){
    for(int j=0; j< mtrx[std::get<0>(tpl)-1].size(); j++){
        mtrx[std::get<0>(tpl)-1][j] = INF;
    }
    for(int i =0; i<mtrx.size();i++){
        mtrx[i][std::get<1>(tpl)-1] = INF;
    }
    mtrx[std::get<1>(tpl)-1][std::get<0>(tpl)-1] = INF;
    return mtrx;
}